

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

xmlCharEncError xmlIconvConvert(void *vctxt,uchar *out,int *outlen,uchar *in,int *inlen,int flush)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  xmlCharEncError xVar4;
  char *icv_out;
  char *icv_in;
  size_t icv_outlen;
  size_t icv_inlen;
  uchar *local_48;
  uchar *local_40;
  size_t local_38;
  size_t local_30;
  
  if ((((outlen == (int *)0x0) || (in == (uchar *)0x0)) || (out == (uchar *)0x0)) ||
     (inlen == (int *)0x0)) {
    xVar4 = XML_ENC_ERR_INTERNAL;
    if (outlen != (int *)0x0) {
      *outlen = 0;
    }
  }
  else {
    local_30 = (size_t)*inlen;
    local_38 = (size_t)*outlen;
    local_48 = out;
    local_40 = in;
    sVar2 = iconv(*vctxt,(char **)&local_40,&local_30,(char **)&local_48,&local_38);
    *inlen = *inlen - (int)local_30;
    *outlen = *outlen - (int)local_38;
    xVar4 = XML_ENC_ERR_SUCCESS;
    if (sVar2 == 0xffffffffffffffff) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      if (iVar1 == 0x54) {
        xVar4 = XML_ENC_ERR_INPUT;
      }
      else {
        xVar4 = XML_ENC_ERR_SUCCESS;
        if (iVar1 != 0x16) {
          if (iVar1 == 7) {
            xVar4 = XML_ENC_ERR_SPACE;
          }
          else {
            xVar4 = XML_ENC_ERR_INTERNAL;
          }
        }
      }
    }
  }
  return xVar4;
}

Assistant:

static xmlCharEncError
xmlIconvConvert(void *vctxt, unsigned char *out, int *outlen,
                const unsigned char *in, int *inlen,
                int flush ATTRIBUTE_UNUSED) {
    xmlIconvCtxt *ctxt = vctxt;
    size_t icv_inlen, icv_outlen;
    const char *icv_in = (const char *) in;
    char *icv_out = (char *) out;
    size_t ret;

    if ((out == NULL) || (outlen == NULL) || (inlen == NULL) || (in == NULL)) {
        if (outlen != NULL) *outlen = 0;
        return(XML_ENC_ERR_INTERNAL);
    }
    icv_inlen = *inlen;
    icv_outlen = *outlen;
    /*
     * Some versions take const, other versions take non-const input.
     */
    ret = iconv(ctxt->cd, (void *) &icv_in, &icv_inlen, &icv_out, &icv_outlen);
    *inlen -= icv_inlen;
    *outlen -= icv_outlen;
    if (ret == (size_t) -1) {
        if (errno == EILSEQ)
            return(XML_ENC_ERR_INPUT);
        if (errno == E2BIG)
            return(XML_ENC_ERR_SPACE);
        /*
         * EINVAL means a truncated multi-byte sequence at the end
         * of the input buffer. We treat this as success.
         */
        if (errno == EINVAL)
            return(XML_ENC_ERR_SUCCESS);
#ifdef __APPLE__
        /*
         * Apple's new libiconv can return EOPNOTSUPP under
         * unknown circumstances (detected when fuzzing).
         */
        if (errno == EOPNOTSUPP)
            return(XML_ENC_ERR_INPUT);
#endif
        return(XML_ENC_ERR_INTERNAL);
    }
    return(XML_ENC_ERR_SUCCESS);
}